

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitagg.cpp
# Opt level: O2

void __thiscall
duckdb::BitwiseOperation::Combine<duckdb::BitState<duckdb::string_t>,duckdb::BitStringAndOperation>
          (BitwiseOperation *this,BitState<duckdb::string_t> *source,
          BitState<duckdb::string_t> *target,AggregateInputData *param_3)

{
  string_t input;
  string_t input_00;
  
  if (*this == (BitwiseOperation)0x1) {
    if (source->is_set != false) {
      input.value.pointer.ptr = (char *)param_3;
      input.value._0_8_ = *(undefined8 *)(this + 0x10);
      BitStringAndOperation::Execute<duckdb::string_t,duckdb::BitState<duckdb::string_t>>
                ((BitStringAndOperation *)source,*(BitState<duckdb::string_t> **)(this + 8),input);
      return;
    }
    input_00.value.pointer.ptr = (char *)param_3;
    input_00.value._0_8_ = *(undefined8 *)(this + 0x10);
    BitStringBitwiseOperation::Assign<duckdb::string_t,duckdb::BitState<duckdb::string_t>>
              ((BitStringBitwiseOperation *)source,*(BitState<duckdb::string_t> **)(this + 8),
               input_00);
    source->is_set = true;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_set) {
			// source is NULL, nothing to do.
			return;
		}
		if (!target.is_set) {
			// target is NULL, use source value directly.
			OP::template Assign<typename STATE::TYPE>(target, source.value);
			target.is_set = true;
		} else {
			OP::template Execute<typename STATE::TYPE>(target, source.value);
		}
	}